

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.h
# Opt level: O0

string * __thiscall
MinVR::VRDataIndex::addData<int>(VRDataIndex *this,string *key,string *nameSpace,int value)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  ulong in_RDX;
  string *in_RDI;
  string *in_stack_000000b0;
  VRDataIndex *in_stack_000000b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string local_68 [20];
  undefined4 in_stack_ffffffffffffffac;
  undefined8 in_stack_ffffffffffffffb0;
  VRDataIndex *in_stack_ffffffffffffffb8;
  
  pcVar1 = (char *)std::__cxx11::string::operator[](in_RDX);
  if (*pcVar1 == '/') {
    addData(in_stack_ffffffffffffffb8,(string *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac)
    ;
  }
  else {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68;
    validateNameSpace(in_stack_000000b8,in_stack_000000b0);
    std::operator+(in_RCX,__rhs);
    addData(in_stack_ffffffffffffffb8,(string *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac)
    ;
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
    std::__cxx11::string::~string(local_68);
  }
  return in_RDI;
}

Assistant:

std::string addData(const std::string &key,
                      const std::string nameSpace, T value) {

    // If the name provided is an absolute name, ignore the nameSpace.
    if (key[0] == '/') {

      return addData(key, value);
    } else {

      return addData(validateNameSpace(nameSpace) + key, value);
    }
  }